

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.cpp
# Opt level: O2

bool __thiscall
ON_AerialPhotoCameraPosition::SetOrientationAnglesDegrees
          (ON_AerialPhotoCameraPosition *this,double omega_degrees,double phi_degrees,
          double kappa_degrees)

{
  bool bVar1;
  
  bVar1 = ON_IsValid(omega_degrees);
  if (((bVar1) && (bVar1 = ON_IsValid(phi_degrees), bVar1)) &&
     (bVar1 = ON_IsValid(kappa_degrees), bVar1)) {
    bVar1 = SetOrientationAnglesRadians
                      (this,(omega_degrees * 3.141592653589793) / 180.0,
                       (phi_degrees * 3.141592653589793) / 180.0,
                       (kappa_degrees * 3.141592653589793) / 180.0);
    ON_3dVector::Set(&this->m_orientation_angles_degrees,omega_degrees,phi_degrees,kappa_degrees);
    return bVar1;
  }
  UnsetOrientation(this);
  return false;
}

Assistant:

bool ON_AerialPhotoCameraPosition::SetOrientationAnglesDegrees(
    double omega_degrees, 
    double phi_degrees, 
    double kappa_degrees
    )
{
  bool rc = false;
  if ( ON_IsValid(omega_degrees) && ON_IsValid(phi_degrees) && ON_IsValid(kappa_degrees) )
  {
    rc = SetOrientationAnglesRadians(omega_degrees*ON_PI/180.0,phi_degrees*ON_PI/180.0,kappa_degrees*ON_PI/180.0);
    // Directly set m_camera_angles_degrees after SetCameraAnglesRadians()
    // so we don't loose a few bits of precision lost by converting to radians
    // and then converting back to degrees.
    m_orientation_angles_degrees.Set(omega_degrees,phi_degrees,kappa_degrees);
  }
  else
  {
    UnsetOrientation();
  }
  return rc;
}